

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall
gutil::Properties::getValue<double>(Properties *this,char *key,double *value,char *defvalue)

{
  byte bVar1;
  undefined8 uVar2;
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  istringstream in;
  string v;
  allocator *__lhs;
  allocator local_251;
  string local_250 [8];
  string *in_stack_fffffffffffffdb8;
  IOException *in_stack_fffffffffffffdc0;
  istringstream local_1d0 [24];
  char *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  Properties *in_stack_fffffffffffffe60;
  string local_40 [40];
  double *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  getString(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
            in_stack_fffffffffffffe48);
  std::__cxx11::istringstream::istringstream(local_1d0,local_40,_S_in);
  std::istream::operator>>(local_1d0,local_18);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::istringstream::~istringstream(local_1d0);
    std::__cxx11::string::~string(local_40);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  __lhs = &local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,(char *)local_10,__lhs);
  std::operator+((char *)__lhs,local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,local_10
                );
  IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void getValue(const char *key, T &value,
                                     const char *defvalue=0) const
    {
      std::string v;

      getString(key, v, defvalue);

      std::istringstream in(v);
      in >> value;

      if (in.fail())
      {
        throw IOException("Format error: "+std::string(key)+"="+v);
      }
    }